

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1536.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  CURLcode CVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  CURLcode ec_1;
  CURLcode ec;
  int res;
  char *scheme;
  CURL *dupe;
  CURL *curl;
  char *URL_local;
  
  scheme = (char *)0x0;
  ec_1 = CURLE_OK;
  curl = (CURL *)URL;
  CVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (CVar2 != CURLE_OK) {
    uVar4 = curl_easy_strerror(CVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1536.c"
                  ,0x22,CVar2,uVar4);
    ec_1 = CVar2;
  }
  if (ec_1 == CURLE_OK) {
    dupe = (CURL *)curl_easy_init();
    if (dupe == (CURL *)0x0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1536.c"
                    ,0x24);
      ec_1 = CURLE_USE_SSL_FAILED|CURLE_SSL_CACERT;
    }
    if (ec_1 == CURLE_OK) {
      ec_1 = curl_easy_getinfo(dupe,0x100031,&ec);
      uVar1 = _stderr;
      if (ec_1 == CURLE_OK) {
        if (_ec == (void *)0x0) {
          CVar2 = curl_easy_setopt(dupe,0x2712,curl);
          uVar1 = _stderr;
          if (CVar2 != CURLE_OK) {
            uVar4 = curl_easy_strerror(CVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1536.c"
                          ,0x36,CVar2,uVar4);
            ec_1 = CVar2;
          }
          if (ec_1 == CURLE_OK) {
            ec_1 = curl_easy_perform(dupe);
            uVar1 = _stderr;
            if (ec_1 == CURLE_OK) {
              ec_1 = curl_easy_getinfo(dupe,0x100031,&ec);
              uVar1 = _stderr;
              if (ec_1 == CURLE_OK) {
                iVar3 = memcmp(_ec,"HTTP",5);
                if (iVar3 == 0) {
                  scheme = (char *)curl_easy_duphandle(dupe);
                  if (scheme == (char *)0x0) {
                    curl_mfprintf(_stderr,"%s:%d curl_easy_duphandle() failed\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1536.c"
                                  ,0x57);
                    ec_1 = CURLE_FAILED_INIT;
                  }
                  else {
                    ec_1 = curl_easy_getinfo(scheme,0x100031,&ec);
                    uVar1 = _stderr;
                    if (ec_1 == CURLE_OK) {
                      if (_ec == (void *)0x0) {
                        curl_easy_reset(dupe);
                        ec_1 = curl_easy_getinfo(dupe,0x100031,&ec);
                        uVar1 = _stderr;
                        if (ec_1 == CURLE_OK) {
                          if (_ec != (void *)0x0) {
                            curl_mfprintf(_stderr,"%s:%d scheme init failed; expected NULL\n",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1536.c"
                                          ,0x77);
                            ec_1 = CURLE_FAILED_INIT;
                          }
                        }
                        else {
                          uVar4 = curl_easy_strerror(ec_1);
                          curl_mfprintf(uVar1,"%s:%d curl_easy_getinfo() failed with code %d (%s)\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1536.c"
                                        ,0x72,ec_1,uVar4);
                        }
                      }
                      else {
                        curl_mfprintf(_stderr,"%s:%d scheme init failed; expected NULL\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1536.c"
                                      ,100);
                        ec_1 = CURLE_FAILED_INIT;
                      }
                    }
                    else {
                      uVar4 = curl_easy_strerror(ec_1);
                      curl_mfprintf(uVar1,"%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1536.c"
                                    ,0x5f,ec_1,uVar4);
                    }
                  }
                }
                else {
                  pcVar5 = "invalid";
                  if (_ec == (void *)0x0) {
                    pcVar5 = "NULL";
                  }
                  curl_mfprintf(_stderr,
                                "%s:%d scheme of http resource is incorrect; expected \'HTTP\' but is %s\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1536.c"
                                ,0x4b,1,pcVar5);
                  ec_1 = CURLE_HTTP_RETURNED_ERROR;
                }
              }
              else {
                uVar4 = curl_easy_strerror(ec_1);
                curl_mfprintf(uVar1,"%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1536.c"
                              ,0x45,ec_1,uVar4);
              }
            }
            else {
              uVar4 = curl_easy_strerror(ec_1);
              curl_mfprintf(uVar1,"%s:%d curl_easy_perform() failed with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1536.c"
                            ,0x3b,ec_1,uVar4);
            }
          }
        }
        else {
          curl_mfprintf(_stderr,"%s:%d scheme init failed; expected NULL\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1536.c"
                        ,0x31);
          ec_1 = CURLE_FAILED_INIT;
        }
      }
      else {
        uVar4 = curl_easy_strerror(ec_1);
        curl_mfprintf(uVar1,"%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1536.c"
                      ,0x2c,ec_1,uVar4);
      }
    }
    curl_easy_cleanup(dupe);
    curl_easy_cleanup(scheme);
    curl_global_cleanup();
    URL_local._4_4_ = ec_1;
  }
  else {
    URL_local._4_4_ = ec_1;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curl, *dupe = NULL;
  char *scheme;
  int res = CURLE_OK;

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  /* Test that scheme is properly initialized on curl_easy_init.
  */

  res = curl_easy_getinfo(curl, CURLINFO_SCHEME, &scheme);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(scheme != NULL) {
    fprintf(stderr, "%s:%d scheme init failed; expected NULL\n",
            __FILE__, __LINE__);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }

  easy_setopt(curl, CURLOPT_URL, URL);

  res = curl_easy_perform(curl);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_perform() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }

  /* Test that a scheme is properly set after receiving an HTTP resource.
  */

  res = curl_easy_getinfo(curl, CURLINFO_SCHEME, &scheme);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(memcmp(scheme, "HTTP", 5) != 0) {
    fprintf(stderr, "%s:%d scheme of http resource is incorrect; "
            "expected 'HTTP' but is %s\n",
            __FILE__, __LINE__, CURLPROTO_HTTP,
            (scheme == NULL ? "NULL" : "invalid"));
    res = CURLE_HTTP_RETURNED_ERROR;
    goto test_cleanup;
  }

  /* Test that a scheme is properly initialized on curl_easy_duphandle.
  */

  dupe = curl_easy_duphandle(curl);
  if(!dupe) {
    fprintf(stderr, "%s:%d curl_easy_duphandle() failed\n",
            __FILE__, __LINE__);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }

  res = curl_easy_getinfo(dupe, CURLINFO_SCHEME, &scheme);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(scheme != 0) {
    fprintf(stderr, "%s:%d scheme init failed; expected NULL\n",
            __FILE__, __LINE__);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }


  /* Test that a scheme is properly initialized on curl_easy_reset.
  */

  curl_easy_reset(curl);

  res = curl_easy_getinfo(curl, CURLINFO_SCHEME, &scheme);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(scheme != 0) {
    fprintf(stderr, "%s:%d scheme init failed; expected NULL\n",
            __FILE__, __LINE__);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }

test_cleanup:
  curl_easy_cleanup(curl);
  curl_easy_cleanup(dupe);
  curl_global_cleanup();
  return res;
}